

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::CampaignReader::InitTransports(CampaignReader *this)

{
  string *__rhs;
  _Base_ptr *__rhs_00;
  _Base_ptr *__rhs_01;
  sqlite3 **ppsVar1;
  string *__lhs;
  vector<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_> *this_00;
  vector<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_> *this_01;
  Mode mode;
  string *psVar2;
  ADIOS *this_02;
  CampaignBPFile *pCVar3;
  sqlite3 *db;
  CampaignData *pCVar4;
  Campaign *pCVar5;
  Engine *pEVar6;
  CampaignReader *pCVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  DataType DVar11;
  char *pcVar12;
  ostream *poVar13;
  IO *pIVar14;
  const_iterator cVar15;
  HostOptions *hostOptions;
  pointer pCVar16;
  Engine *pEVar17;
  Variable<signed_char> *variable;
  Variable<char> *variable_00;
  Variable<std::complex<float>_> *variable_01;
  Variable<unsigned_char> *variable_02;
  Variable<std::complex<double>_> *variable_03;
  Variable<double> *variable_04;
  Variable<int> *variable_05;
  Variable<long> *variable_06;
  Variable<unsigned_long> *variable_07;
  Variable<short> *variable_08;
  Variable<unsigned_short> *variable_09;
  Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *variable_10;
  Variable<unsigned_int> *variable_11;
  Variable<long_double> *variable_12;
  Variable<float> *variable_13;
  _Base_ptr p_Var18;
  Attribute<signed_char> *attribute;
  Attribute<char> *attribute_00;
  Attribute<std::complex<float>_> *attribute_01;
  Attribute<unsigned_char> *attribute_02;
  Attribute<std::complex<double>_> *attribute_03;
  Attribute<double> *attribute_04;
  Attribute<int> *attribute_05;
  Attribute<long> *attribute_06;
  Attribute<unsigned_long> *attribute_07;
  Attribute<short> *attribute_08;
  Attribute<unsigned_short> *attribute_09;
  Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *attribute_10;
  Attribute<unsigned_int> *attribute_11;
  Attribute<long_double> *attribute_12;
  Attribute<float> *attribute_13;
  _Rb_tree_node_base *p_Var19;
  _Base_ptr p_Var20;
  size_t keyidx;
  pointer pCVar21;
  size_t diridx;
  ulong uVar22;
  string *psVar23;
  CampaignBPFile *bpfile;
  size_t hostidx;
  ulong uVar24;
  long lVar25;
  allocator local_80a;
  allocator local_809;
  CampaignReader *local_808;
  IO *local_800;
  _Base_ptr local_7f8;
  string newname;
  Remote *local_7d0;
  VarInternalInfo internalInfo;
  Comm local_7a8;
  string fname;
  string es;
  string localPath;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  vmap;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  amap;
  string path;
  string local_668;
  string local_648;
  string local_628;
  string path2;
  string local_330;
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Engine).m_Name;
  local_808 = this;
  std::__cxx11::string::string((string *)&path,(string *)__rhs);
  bVar8 = adios2sys::SystemTools::FileExists(&path);
  if ((((!bVar8) && (*path._M_dataplus._M_p != '/')) && (*path._M_dataplus._M_p != '\\')) &&
     ((local_808->m_Options).campaignstorepath._M_string_length != 0)) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap,
                   &(local_808->m_Options).campaignstorepath,'/');
    std::operator+(&path2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap
                   ,__rhs);
    std::__cxx11::string::~string((string *)&vmap);
    bVar8 = adios2sys::SystemTools::FileExists(&path2);
    if (bVar8) {
      std::__cxx11::string::_M_assign((string *)&path);
    }
    std::__cxx11::string::~string((string *)&path2);
  }
  ppsVar1 = &local_808->m_DB;
  iVar10 = sqlite3_open(path._M_dataplus._M_p);
  if (iVar10 != 0) {
    pcVar12 = (char *)sqlite3_errmsg(*ppsVar1);
    std::__cxx11::string::string((string *)&path2,pcVar12,(allocator *)&vmap);
    sqlite3_close(*ppsVar1);
    std::__cxx11::string::string((string *)&vmap,"Engine",(allocator *)&internalInfo);
    std::__cxx11::string::string((string *)&amap,"CampaignReader",&local_809);
    std::__cxx11::string::string((string *)&localPath,"Open",&local_80a);
    std::operator+(&newname,"Cannot open database",&path);
    std::operator+(&fname,&newname,": ");
    std::operator+(&es,&fname,&path2);
    helper::Throw<std::invalid_argument>((string *)&vmap,(string *)&amap,&localPath,&es,-1);
    std::__cxx11::string::~string((string *)&es);
    std::__cxx11::string::~string((string *)&fname);
    std::__cxx11::string::~string((string *)&newname);
    std::__cxx11::string::~string((string *)&localPath);
    std::__cxx11::string::~string((string *)&amap);
    std::__cxx11::string::~string((string *)&vmap);
    std::__cxx11::string::~string((string *)&path2);
  }
  ReadCampaignData(local_808->m_DB,&local_808->m_CampaignData);
  if (0 < (local_808->m_Options).verbose) {
    poVar13 = std::operator<<((ostream *)&std::cout,"Local hostname = ");
    poVar13 = std::operator<<(poVar13,(string *)&(local_808->m_Options).hostname);
    std::operator<<(poVar13,"\n");
    std::operator<<((ostream *)&std::cout,"Database result:\n  version = ");
    poVar13 = std::ostream::_M_insert<double>((local_808->m_CampaignData).version.version);
    std::operator<<(poVar13,"\n  hosts:\n");
    for (uVar24 = 0;
        pCVar21 = (local_808->m_CampaignData).hosts.
                  super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar24 < (ulong)(((long)(local_808->m_CampaignData).hosts.
                                super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar21) / 0x58);
        uVar24 = uVar24 + 1) {
      poVar13 = std::operator<<((ostream *)&std::cout,"    host = ");
      pCVar21 = pCVar21 + uVar24;
      poVar13 = std::operator<<(poVar13,(string *)pCVar21);
      poVar13 = std::operator<<(poVar13,"  long name = ");
      poVar13 = std::operator<<(poVar13,(string *)&pCVar21->longhostname);
      std::operator<<(poVar13,"  directories: \n");
      for (uVar22 = 0;
          uVar22 < (ulong)((long)(pCVar21->dirIdx).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           *(long *)&(pCVar21->dirIdx).
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data >> 3); uVar22 = uVar22 + 1) {
        poVar13 = std::operator<<((ostream *)&std::cout,"      dir = ");
        poVar13 = std::operator<<(poVar13,(string *)
                                          ((local_808->m_CampaignData).directory.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                          *(long *)(*(long *)&(pCVar21->dirIdx).
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + uVar22 * 8)));
        std::operator<<(poVar13,"\n");
      }
    }
    std::operator<<((ostream *)&std::cout,"  keys:\n");
    lVar25 = 0;
    for (uVar24 = 0;
        pCVar16 = (local_808->m_CampaignData).keys.
                  super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar24 < (ulong)((long)(local_808->m_CampaignData).keys.
                               super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar16 >> 6);
        uVar24 = uVar24 + 1) {
      poVar13 = std::operator<<((ostream *)&std::cout,"    key = ");
      poVar13 = std::operator<<(poVar13,(string *)((long)&(pCVar16->id)._M_dataplus._M_p + lVar25));
      std::operator<<(poVar13,"\n");
      lVar25 = lVar25 + 0x40;
    }
    std::operator<<((ostream *)&std::cout,"  datasets:\n");
    local_800 = (IO *)&(local_808->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header;
    for (pIVar14 = (IO *)(local_808->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header.
                         _M_header._M_left; pIVar14 != local_800;
        pIVar14 = (IO *)std::_Rb_tree_increment((_Rb_tree_node_base *)pIVar14)) {
      poVar13 = std::operator<<((ostream *)&std::cout,"    ");
      poVar13 = std::operator<<(poVar13,(string *)
                                        ((local_808->m_CampaignData).hosts.
                                         super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                        *(long *)&(pIVar14->m_Parameters)._M_t._M_impl.
                                                  super__Rb_tree_header._M_header));
      poVar13 = std::operator<<(poVar13,":");
      poVar13 = std::operator<<(poVar13,(string *)
                                        ((local_808->m_CampaignData).directory.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start +
                                        (long)(pIVar14->m_Parameters)._M_t._M_impl.
                                              super__Rb_tree_header._M_header._M_parent));
      poVar13 = std::operator<<(poVar13,'/');
      poVar13 = std::operator<<(poVar13,(string *)(pIVar14->m_HostLanguage).field_2._M_local_buf);
      std::operator<<(poVar13,"\n");
      poVar13 = std::operator<<((ostream *)&std::cout,"      uuid: ");
      poVar13 = std::operator<<(poVar13,(string *)(pIVar14->m_Name).field_2._M_local_buf);
      std::operator<<(poVar13,"\n");
      psVar2 = (string *)
               (pIVar14->m_TransportsParameters).
               super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (psVar23 = (string *)
                     (pIVar14->m_Parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count;
          psVar23 != psVar2; psVar23 = psVar23 + 0x48) {
        poVar13 = std::operator<<((ostream *)&std::cout,"      file: ");
        poVar13 = std::operator<<(poVar13,psVar23);
        std::operator<<(poVar13,"\n");
      }
    }
  }
  iVar10 = -1;
  p_Var20 = (local_808->m_CampaignData).bpdatasets._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  pCVar4 = &local_808->m_CampaignData;
  pCVar5 = &local_808->m_Options;
  __lhs = &(local_808->m_Options).cachepath;
  pEVar6 = &local_808->super_Engine;
  this_00 = &local_808->m_IOs;
  this_01 = &local_808->m_Engines;
  local_7d0 = (Remote *)0x0;
  do {
    if ((_Rb_tree_header *)p_Var20 == &(pCVar4->bpdatasets)._M_t._M_impl.super__Rb_tree_header) {
      if (local_7d0 != (Remote *)0x0) {
        (*local_7d0->_vptr_Remote[1])();
      }
      std::__cxx11::string::~string((string *)&path);
      return;
    }
    iVar10 = iVar10 + 1;
    this_02 = ((local_808->super_Engine).m_IO)->m_ADIOS;
    local_7f8 = p_Var20;
    std::__cxx11::to_string(&path2,iVar10);
    std::operator+(&local_2f0,"CampaignReader",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2);
    local_800 = ADIOS::DeclareIO(this_02,&local_2f0,Auto);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&path2);
    p_Var20 = local_7f8;
    pCVar7 = local_808;
    localPath._M_dataplus._M_p = (pointer)&localPath.field_2;
    localPath._M_string_length = 0;
    localPath.field_2._M_local_buf[0] = '\0';
    bVar8 = std::operator!=(&(local_808->m_CampaignData).hosts.
                             super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)local_7f8[3]._M_parent]
                             .hostname,&pCVar5->hostname);
    if (bVar8) {
      cVar15 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>_>_>_>
               ::find(&((pCVar7->super_Engine).m_HostOptions)->_M_t,
                      &(pCVar7->m_CampaignData).hosts.
                       super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)p_Var20[3]._M_parent].
                       hostname);
      p_Var20 = local_7f8;
      if (((_Rb_tree_header *)cVar15._M_node !=
           &(((pCVar7->super_Engine).m_HostOptions)->_M_t)._M_impl.super__Rb_tree_header) &&
         (lVar25 = *(long *)(cVar15._M_node + 2), *(int *)(lVar25 + 0x20) == 3)) {
        std::__cxx11::string::string((string *)&vmap,(string *)(lVar25 + 0x90));
        p_Var20 = local_7f8;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                       (local_808->m_CampaignData).directory.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (long)local_7f8[3]._M_left,"/");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&amap,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var20[2]._M_parent);
        std::__cxx11::string::~string((string *)&path2);
        path2._M_string_length = path2._M_string_length & 0xffffffff00000000;
        path2.field_2._M_allocated_capacity = 0;
        path2.field_2._8_8_ = &path2._M_string_length;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[8],char_const(&)[7]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&path2,(char (*) [8])0x6d7518,(char (*) [7])"awssdk");
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[9],std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&path2,(char (*) [9])"endpoint",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &internalInfo,__lhs,'/');
        std::operator+(&newname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&internalInfo,
                       &(local_808->m_CampaignData).hosts.
                        super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)local_7f8[3]._M_parent].
                        hostname);
        std::operator+(&fname,&newname,'/');
        std::operator+(&es,&fname,__rhs);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[6],std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&path2,(char (*) [6])0x6ccac9,&es);
        std::__cxx11::string::~string((string *)&es);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&newname);
        std::__cxx11::string::~string((string *)&internalInfo);
        std::__cxx11::to_string(&es,*(int *)(lVar25 + 0xd4));
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[8],std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&path2,(char (*) [8])0x6d86be,&es);
        std::__cxx11::string::~string((string *)&es);
        pcVar12 = "AWS_EC2_METADATA_DISABLED=false";
        if (*(char *)(lVar25 + 0xd1) != '\0') {
          pcVar12 = "AWS_EC2_METADATA_DISABLED=true";
        }
        es._M_dataplus._M_p = pcVar12 + 0x1a;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<char_const(&)[17],char_const*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&path2,(char (*) [17])"recheck_metadata",(char **)&es);
        std::__cxx11::string::string((string *)&local_310,"File",(allocator *)&es);
        IO::AddTransport(local_800,&local_310,(Params *)&path2);
        std::__cxx11::string::~string((string *)&local_310);
        std::__cxx11::string::string((string *)&local_50,"BP5",(allocator *)&es);
        IO::SetEngine(local_800,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::operator+(&fname,(local_808->m_CampaignData).directory.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)local_7f8[3]._M_left
                       ,'/');
        std::operator+(&es,&fname,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &p_Var20[2]._M_parent);
        std::__cxx11::string::operator=((string *)&localPath,(string *)&es);
        std::__cxx11::string::~string((string *)&es);
        std::__cxx11::string::~string((string *)&fname);
        if (*(char *)(lVar25 + 0xd0) == '\x01') {
          std::__cxx11::string::string
                    ((string *)&es,"AWS_EC2_METADATA_DISABLED=false",(allocator *)&fname);
          adios2sys::SystemTools::PutEnv(&es);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&es,"AWS_EC2_METADATA_DISABLED=true",(allocator *)&fname);
          adios2sys::SystemTools::PutEnv(&es);
        }
        std::__cxx11::string::~string((string *)&es);
        if (*(long *)(lVar25 + 0xb8) == 0) {
          std::__cxx11::string::string((string *)&es,"AWS_PROFILE=default",(allocator *)&fname);
          adios2sys::SystemTools::PutEnv(&es);
        }
        else {
          std::operator+(&es,"AWS_PROFILE=",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (lVar25 + 0xb0));
          adios2sys::SystemTools::PutEnv(&es);
        }
        std::__cxx11::string::~string((string *)&es);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&path2);
        std::__cxx11::string::~string((string *)&amap);
        std::__cxx11::string::~string((string *)&vmap);
        goto LAB_0060bd79;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                     (local_808->m_CampaignData).directory.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)local_7f8[3]._M_left,'/');
      __rhs_00 = &p_Var20[2]._M_parent;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_00);
      std::__cxx11::string::~string((string *)&path2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                     &(local_808->m_CampaignData).hosts.
                      super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)p_Var20[3]._M_parent].hostname
                     ,":");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&amap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap);
      std::__cxx11::string::~string((string *)&path2);
      std::operator+(&newname,__lhs,'/');
      __rhs_01 = &local_7f8[1]._M_parent;
      std::__cxx11::string::substr((ulong)&internalInfo,(ulong)__rhs_01);
      std::operator+(&fname,&newname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &internalInfo);
      std::operator+(&es,&fname,'/');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,&es
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs_01)
      ;
      std::__cxx11::string::operator=((string *)&localPath,(string *)&path2);
      std::__cxx11::string::~string((string *)&path2);
      std::__cxx11::string::~string((string *)&es);
      std::__cxx11::string::~string((string *)&fname);
      std::__cxx11::string::~string((string *)&internalInfo);
      std::__cxx11::string::~string((string *)&newname);
      if (0 < (local_808->m_Options).verbose) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Open remote file ");
        poVar13 = std::operator<<(poVar13,(string *)&amap);
        poVar13 = std::operator<<(poVar13,"\n    and use local cache for metadata at ");
        poVar13 = std::operator<<(poVar13,(string *)&localPath);
        std::operator<<(poVar13," \n");
      }
      helper::CreateDirectory(&localPath);
      es._M_dataplus._M_p = (pointer)&es.field_2;
      es._M_string_length = 0;
      es.field_2._M_local_buf[0] = '\0';
      if (*(char *)&local_7f8[3]._M_right == '\x01') {
        if (0 < (local_808->m_Options).verbose) {
          poVar13 = std::operator<<((ostream *)&std::cout,
                                    "The dataset is key protected with key id ");
          poVar13 = std::operator<<(poVar13,(string *)
                                            ((local_808->m_CampaignData).keys.
                                             super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                            *(long *)(local_7f8 + 4)));
          std::operator<<(poVar13,"\n");
        }
        lVar25 = *(long *)(local_7f8 + 4);
        pCVar16 = (local_808->m_CampaignData).keys.
                  super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pCVar16[lVar25].keyHex._M_string_length == 0) {
          if (local_7d0 == (Remote *)0x0) {
            local_7d0 = (Remote *)operator_new(0x20);
            hostOptions = ADIOS::StaticGetHostOptions_abi_cxx11_();
            Remote::Remote(local_7d0,hostOptions);
            lVar25 = *(long *)(local_7f8 + 4);
            pCVar16 = (local_808->m_CampaignData).keys.
                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          std::__cxx11::string::string((string *)&local_330,(string *)(pCVar16 + lVar25));
          Remote::GetKeyFromConnectionManager(&path2,local_7d0,&local_330);
          pCVar7 = local_808;
          std::__cxx11::string::operator=
                    ((string *)
                     &(local_808->m_CampaignData).keys.
                      super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                      ._M_impl.super__Vector_impl_data._M_start[*(long *)(local_7f8 + 4)].keyHex,
                     (string *)&path2);
          std::__cxx11::string::~string((string *)&path2);
          std::__cxx11::string::~string((string *)&local_330);
          if (0 < (pCVar7->m_Options).verbose) {
            poVar13 = std::operator<<((ostream *)&std::cout,"-- Received key ");
            poVar13 = std::operator<<(poVar13,(string *)
                                              &(local_808->m_CampaignData).keys.
                                               super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                               ._M_impl.super__Vector_impl_data._M_start
                                               [*(long *)(local_7f8 + 4)].keyHex);
            std::operator<<(poVar13,"\n");
          }
        }
        bVar8 = std::operator==(&(local_808->m_CampaignData).keys.
                                 super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                 ._M_impl.super__Vector_impl_data._M_start[*(long *)(local_7f8 + 4)]
                                 .keyHex,"0");
        if (!bVar8) {
          std::__cxx11::string::_M_assign((string *)&es);
          goto LAB_0060b9dd;
        }
        poVar13 = std::operator<<((ostream *)&std::cerr,"ERROR: don\'t have the key ");
        poVar13 = std::operator<<(poVar13,(string *)
                                          ((local_808->m_CampaignData).keys.
                                           super__Vector_base<adios2::core::engine::CampaignKey,_std::allocator<adios2::core::engine::CampaignKey>_>
                                           ._M_impl.super__Vector_impl_data._M_start +
                                          *(long *)(local_7f8 + 4)));
        poVar13 = std::operator<<(poVar13," to decrypt ");
        poVar13 = std::operator<<(poVar13,(string *)__rhs_00);
        poVar13 = std::operator<<(poVar13,". Ignoring this dataset.");
        std::endl<char,std::char_traits<char>>(poVar13);
        bVar8 = false;
      }
      else {
LAB_0060b9dd:
        pCVar3 = (CampaignBPFile *)local_7f8[4]._M_left;
        for (bpfile = (CampaignBPFile *)local_7f8[4]._M_parent; bpfile != pCVar3;
            bpfile = bpfile + 1) {
          db = *ppsVar1;
          std::operator+(&fname,&localPath,'/');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2
                         ,&fname,&bpfile->name);
          SaveToFile(db,&path2,bpfile,&es);
          std::__cxx11::string::~string((string *)&path2);
          std::__cxx11::string::~string((string *)&fname);
        }
        std::__cxx11::string::string((string *)&local_628,"RemoteDataPath",(allocator *)&path2);
        std::__cxx11::string::string((string *)&local_70,(string *)&vmap);
        IO::SetParameter(local_800,&local_628,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_628);
        std::__cxx11::string::string((string *)&local_648,"RemoteHost",(allocator *)&path2);
        std::__cxx11::string::string
                  ((string *)&local_90,
                   (string *)
                   ((local_808->m_CampaignData).hosts.
                    super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                    ._M_impl.super__Vector_impl_data._M_start + (long)local_7f8[3]._M_parent));
        IO::SetParameter(local_800,&local_648,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_648);
        std::__cxx11::string::string((string *)&local_668,"UUID",(allocator *)&path2);
        std::__cxx11::string::string((string *)&local_b0,(string *)__rhs_01);
        IO::SetParameter(local_800,&local_668,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_668);
        std::operator+(&newname,&localPath,'/');
        std::operator+(&fname,&newname,"info.txt");
        std::ofstream::ofstream
                  ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&path2,(string *)&fname,_S_out);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&newname);
        cVar9 = std::__basic_file<char>::is_open();
        if (cVar9 != '\0') {
          poVar13 = std::operator<<((ostream *)&path2,"Campaign = ");
          poVar13 = std::operator<<(poVar13,(string *)__rhs);
          std::operator<<(poVar13,"\n");
          poVar13 = std::operator<<((ostream *)&path2,"Dataset = ");
          poVar13 = std::operator<<(poVar13,(string *)__rhs_00);
          std::operator<<(poVar13,"\n");
          poVar13 = std::operator<<((ostream *)&path2,"RemoteHost = ");
          poVar13 = std::operator<<(poVar13,(string *)
                                            ((local_808->m_CampaignData).hosts.
                                             super__Vector_base<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
                                             ._M_impl.super__Vector_impl_data._M_start +
                                            (long)local_7f8[3]._M_parent));
          std::operator<<(poVar13,"\n");
          poVar13 = std::operator<<((ostream *)&path2,"RemoteDataPath = ");
          poVar13 = std::operator<<(poVar13,(string *)&vmap);
          std::operator<<(poVar13,"\n");
          std::ofstream::close();
        }
        std::ofstream::~ofstream
                  ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&path2);
        bVar8 = true;
      }
      std::__cxx11::string::~string((string *)&es);
      std::__cxx11::string::~string((string *)&amap);
      std::__cxx11::string::~string((string *)&vmap);
      if (bVar8) goto LAB_0060bd79;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap,
                     (pCVar7->m_CampaignData).directory.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (long)p_Var20[3]._M_left,'/');
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vmap,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &p_Var20[2]._M_parent);
      std::__cxx11::string::operator=((string *)&localPath,(string *)&path2);
      std::__cxx11::string::~string((string *)&path2);
      std::__cxx11::string::~string((string *)&vmap);
      if (0 < (local_808->m_Options).verbose) {
        poVar13 = std::operator<<((ostream *)&std::cout,"Open local file ");
        poVar13 = std::operator<<(poVar13,(string *)&localPath);
        std::operator<<(poVar13,"\n");
      }
LAB_0060bd79:
      mode = (local_808->super_Engine).m_OpenMode;
      path2._M_dataplus._M_p = (pointer)&path2.field_2;
      path2._M_string_length = 0;
      path2.field_2._M_allocated_capacity = path2.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      helper::Comm::Duplicate(&local_7a8,(string *)&pEVar6->m_Comm);
      pIVar14 = local_800;
      pEVar17 = IO::Open(local_800,&localPath,mode,&local_7a8,(char *)0x0,0);
      helper::Comm::~Comm(&local_7a8);
      std::__cxx11::string::~string((string *)&path2);
      path2._M_dataplus._M_p = (pointer)pIVar14;
      std::vector<adios2::core::IO*,std::allocator<adios2::core::IO*>>::
      emplace_back<adios2::core::IO*>
                ((vector<adios2::core::IO*,std::allocator<adios2::core::IO*>> *)this_00,
                 (IO **)&path2);
      path2._M_dataplus._M_p = (pointer)pEVar17;
      std::vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>>::
      emplace_back<adios2::core::Engine*>
                ((vector<adios2::core::Engine*,std::allocator<adios2::core::Engine*>> *)this_01,
                 (Engine **)&path2);
      pIVar14 = local_800;
      path2._M_dataplus._M_p = (pointer)0x0;
      path2._M_string_length = 0;
      path2.field_2._M_allocated_capacity = 0;
      path2.field_2._8_8_ = &path2._M_string_length;
      IO::GetAvailableVariables
                (&vmap,local_800,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&path2);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&path2);
      path2._M_dataplus._M_p = (pointer)&path2.field_2;
      path2._M_string_length = 0;
      path2.field_2._M_allocated_capacity = path2.field_2._M_allocated_capacity & 0xffffffffffffff00
      ;
      std::__cxx11::string::string((string *)&local_d0,"/",(allocator *)&es);
      IO::GetAvailableAttributes(&amap,pIVar14,&path2,&local_d0,false);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&path2);
      internalInfo.ioIdx =
           ((long)(local_808->m_IOs).
                  super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_808->m_IOs).
                  super__Vector_base<adios2::core::IO_*,_std::allocator<adios2::core::IO_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      internalInfo.engineIdx =
           ((long)(local_808->m_Engines).
                  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_808->m_Engines).
                  super__Vector_base<adios2::core::Engine_*,_std::allocator<adios2::core::Engine_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
      internalInfo.originalVar = (void *)0x0;
      p_Var20 = local_7f8 + 2;
      for (p_Var18 = vmap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var19 = amap._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          (_Rb_tree_header *)p_Var18 != &vmap._M_t._M_impl.super__Rb_tree_header;
          p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18)) {
        std::__cxx11::string::string((string *)&es,(string *)(p_Var18 + 1));
        std::__cxx11::string::string((string *)&fname,(string *)&p_Var20->_M_parent);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                       &fname,"/");
        std::operator+(&newname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&path2,&es);
        std::__cxx11::string::~string((string *)&path2);
        DVar11 = IO::InquireVariableType(local_800,&es);
        switch(DVar11) {
        case Int8:
          variable = IO::InquireVariable<signed_char>(local_800,&es);
          DuplicateVariable<signed_char>
                    ((Variable<signed_char> *)&path2,local_808,variable,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<signed_char>::~Variable((Variable<signed_char> *)&path2);
          break;
        case Int16:
          variable_08 = IO::InquireVariable<short>(local_800,&es);
          DuplicateVariable<short>
                    ((Variable<short> *)&path2,local_808,variable_08,(local_808->super_Engine).m_IO,
                     &newname,&internalInfo);
          Variable<short>::~Variable((Variable<short> *)&path2);
          break;
        case Int32:
          variable_05 = IO::InquireVariable<int>(local_800,&es);
          DuplicateVariable<int>
                    ((Variable<int> *)&path2,local_808,variable_05,(local_808->super_Engine).m_IO,
                     &newname,&internalInfo);
          Variable<int>::~Variable((Variable<int> *)&path2);
          break;
        case Int64:
          variable_06 = IO::InquireVariable<long>(local_800,&es);
          DuplicateVariable<long>
                    ((Variable<long> *)&path2,local_808,variable_06,(local_808->super_Engine).m_IO,
                     &newname,&internalInfo);
          Variable<long>::~Variable((Variable<long> *)&path2);
          break;
        case UInt8:
          variable_02 = IO::InquireVariable<unsigned_char>(local_800,&es);
          DuplicateVariable<unsigned_char>
                    ((Variable<unsigned_char> *)&path2,local_808,variable_02,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<unsigned_char>::~Variable((Variable<unsigned_char> *)&path2);
          break;
        case UInt16:
          variable_09 = IO::InquireVariable<unsigned_short>(local_800,&es);
          DuplicateVariable<unsigned_short>
                    ((Variable<unsigned_short> *)&path2,local_808,variable_09,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<unsigned_short>::~Variable((Variable<unsigned_short> *)&path2);
          break;
        case UInt32:
          variable_11 = IO::InquireVariable<unsigned_int>(local_800,&es);
          DuplicateVariable<unsigned_int>
                    ((Variable<unsigned_int> *)&path2,local_808,variable_11,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<unsigned_int>::~Variable((Variable<unsigned_int> *)&path2);
          break;
        case UInt64:
          variable_07 = IO::InquireVariable<unsigned_long>(local_800,&es);
          DuplicateVariable<unsigned_long>
                    ((Variable<unsigned_long> *)&path2,local_808,variable_07,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<unsigned_long>::~Variable((Variable<unsigned_long> *)&path2);
          break;
        case Float:
          variable_13 = IO::InquireVariable<float>(local_800,&es);
          DuplicateVariable<float>
                    ((Variable<float> *)&path2,local_808,variable_13,(local_808->super_Engine).m_IO,
                     &newname,&internalInfo);
          Variable<float>::~Variable((Variable<float> *)&path2);
          break;
        case Double:
          variable_04 = IO::InquireVariable<double>(local_800,&es);
          DuplicateVariable<double>
                    ((Variable<double> *)&path2,local_808,variable_04,(local_808->super_Engine).m_IO
                     ,&newname,&internalInfo);
          Variable<double>::~Variable((Variable<double> *)&path2);
          break;
        case LongDouble:
          variable_12 = IO::InquireVariable<long_double>(local_800,&es);
          DuplicateVariable<long_double>
                    ((Variable<long_double> *)&path2,local_808,variable_12,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<long_double>::~Variable((Variable<long_double> *)&path2);
          break;
        case FloatComplex:
          variable_01 = IO::InquireVariable<std::complex<float>>(local_800,&es);
          DuplicateVariable<std::complex<float>>
                    ((Variable<std::complex<float>_> *)&path2,local_808,variable_01,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<std::complex<float>_>::~Variable((Variable<std::complex<float>_> *)&path2);
          break;
        case DoubleComplex:
          variable_03 = IO::InquireVariable<std::complex<double>>(local_800,&es);
          DuplicateVariable<std::complex<double>>
                    ((Variable<std::complex<double>_> *)&path2,local_808,variable_03,
                     (local_808->super_Engine).m_IO,&newname,&internalInfo);
          Variable<std::complex<double>_>::~Variable((Variable<std::complex<double>_> *)&path2);
          break;
        case String:
          variable_10 = IO::InquireVariable<std::__cxx11::string>(local_800,&es);
          DuplicateVariable<std::__cxx11::string>
                    ((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&path2,local_808,variable_10,(local_808->super_Engine).m_IO,&newname,
                     &internalInfo);
          Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Variable((Variable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&path2);
          break;
        case Char:
          variable_00 = IO::InquireVariable<char>(local_800,&es);
          DuplicateVariable<char>
                    ((Variable<char> *)&path2,local_808,variable_00,(local_808->super_Engine).m_IO,
                     &newname,&internalInfo);
          Variable<char>::~Variable((Variable<char> *)&path2);
        }
        std::__cxx11::string::~string((string *)&newname);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&es);
      }
      for (; (_Rb_tree_header *)p_Var19 != &amap._M_t._M_impl.super__Rb_tree_header;
          p_Var19 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var19)) {
        std::__cxx11::string::string((string *)&es,(string *)(p_Var19 + 1));
        std::__cxx11::string::string((string *)&fname,(string *)&p_Var20->_M_parent);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&path2,
                       &fname,"/");
        std::operator+(&newname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&path2,&es);
        std::__cxx11::string::~string((string *)&path2);
        std::__cxx11::string::string((string *)&path2,"",&local_809);
        std::__cxx11::string::string((string *)&local_f0,"/",&local_80a);
        DVar11 = IO::InquireAttributeType(local_800,&es,&path2,&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&path2);
        switch(DVar11) {
        case Int8:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_150,"/",&local_80a);
          attribute = IO::InquireAttribute<signed_char>(local_800,&es,&path2,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<signed_char>
                    ((Attribute<signed_char> *)&path2,local_808,attribute,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<signed_char>::~Attribute((Attribute<signed_char> *)&path2);
          break;
        case Int16:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_170,"/",&local_80a);
          attribute_08 = IO::InquireAttribute<short>(local_800,&es,&path2,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<short>
                    ((Attribute<short> *)&path2,local_808,attribute_08,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<short>::~Attribute((Attribute<short> *)&path2);
          break;
        case Int32:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_190,"/",&local_80a);
          attribute_05 = IO::InquireAttribute<int>(local_800,&es,&path2,&local_190);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<int>
                    ((Attribute<int> *)&path2,local_808,attribute_05,(local_808->super_Engine).m_IO,
                     &newname);
          Attribute<int>::~Attribute((Attribute<int> *)&path2);
          break;
        case Int64:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_1b0,"/",&local_80a);
          attribute_06 = IO::InquireAttribute<long>(local_800,&es,&path2,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<long>
                    ((Attribute<long> *)&path2,local_808,attribute_06,(local_808->super_Engine).m_IO
                     ,&newname);
          Attribute<long>::~Attribute((Attribute<long> *)&path2);
          break;
        case UInt8:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_1d0,"/",&local_80a);
          attribute_02 = IO::InquireAttribute<unsigned_char>(local_800,&es,&path2,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<unsigned_char>
                    ((Attribute<unsigned_char> *)&path2,local_808,attribute_02,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<unsigned_char>::~Attribute((Attribute<unsigned_char> *)&path2);
          break;
        case UInt16:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_1f0,"/",&local_80a);
          attribute_09 = IO::InquireAttribute<unsigned_short>(local_800,&es,&path2,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<unsigned_short>
                    ((Attribute<unsigned_short> *)&path2,local_808,attribute_09,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<unsigned_short>::~Attribute((Attribute<unsigned_short> *)&path2);
          break;
        case UInt32:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_210,"/",&local_80a);
          attribute_11 = IO::InquireAttribute<unsigned_int>(local_800,&es,&path2,&local_210);
          std::__cxx11::string::~string((string *)&local_210);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<unsigned_int>
                    ((Attribute<unsigned_int> *)&path2,local_808,attribute_11,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<unsigned_int>::~Attribute((Attribute<unsigned_int> *)&path2);
          break;
        case UInt64:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_230,"/",&local_80a);
          attribute_07 = IO::InquireAttribute<unsigned_long>(local_800,&es,&path2,&local_230);
          std::__cxx11::string::~string((string *)&local_230);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<unsigned_long>
                    ((Attribute<unsigned_long> *)&path2,local_808,attribute_07,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<unsigned_long>::~Attribute((Attribute<unsigned_long> *)&path2);
          break;
        case Float:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_250,"/",&local_80a);
          attribute_13 = IO::InquireAttribute<float>(local_800,&es,&path2,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<float>
                    ((Attribute<float> *)&path2,local_808,attribute_13,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<float>::~Attribute((Attribute<float> *)&path2);
          break;
        case Double:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_270,"/",&local_80a);
          attribute_04 = IO::InquireAttribute<double>(local_800,&es,&path2,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<double>
                    ((Attribute<double> *)&path2,local_808,attribute_04,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<double>::~Attribute((Attribute<double> *)&path2);
          break;
        case LongDouble:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_290,"/",&local_80a);
          attribute_12 = IO::InquireAttribute<long_double>(local_800,&es,&path2,&local_290);
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<long_double>
                    ((Attribute<long_double> *)&path2,local_808,attribute_12,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<long_double>::~Attribute((Attribute<long_double> *)&path2);
          break;
        case FloatComplex:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_2b0,"/",&local_80a);
          attribute_01 = IO::InquireAttribute<std::complex<float>>(local_800,&es,&path2,&local_2b0);
          std::__cxx11::string::~string((string *)&local_2b0);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<std::complex<float>>
                    ((Attribute<std::complex<float>_> *)&path2,local_808,attribute_01,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<std::complex<float>_>::~Attribute((Attribute<std::complex<float>_> *)&path2);
          break;
        case DoubleComplex:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_2d0,"/",&local_80a);
          attribute_03 = IO::InquireAttribute<std::complex<double>>(local_800,&es,&path2,&local_2d0)
          ;
          std::__cxx11::string::~string((string *)&local_2d0);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<std::complex<double>>
                    ((Attribute<std::complex<double>_> *)&path2,local_808,attribute_03,
                     (local_808->super_Engine).m_IO,&newname);
          Attribute<std::complex<double>_>::~Attribute((Attribute<std::complex<double>_> *)&path2);
          break;
        case String:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_110,"/",&local_80a);
          attribute_10 = IO::InquireAttribute<std::__cxx11::string>(local_800,&es,&path2,&local_110)
          ;
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<std::__cxx11::string>
                    ((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&path2,local_808,attribute_10,(local_808->super_Engine).m_IO,&newname);
          Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Attribute((Attribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&path2);
          break;
        case Char:
          std::__cxx11::string::string((string *)&path2,"",&local_809);
          std::__cxx11::string::string((string *)&local_130,"/",&local_80a);
          attribute_00 = IO::InquireAttribute<char>(local_800,&es,&path2,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&path2);
          DuplicateAttribute<char>
                    ((Attribute<char> *)&path2,local_808,attribute_00,(local_808->super_Engine).m_IO
                     ,&newname);
          Attribute<char>::~Attribute((Attribute<char> *)&path2);
        }
        std::__cxx11::string::~string((string *)&newname);
        std::__cxx11::string::~string((string *)&fname);
        std::__cxx11::string::~string((string *)&es);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree(&amap._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~_Rb_tree(&vmap._M_t);
    }
    std::__cxx11::string::~string((string *)&localPath);
    p_Var20 = (_Base_ptr)std::_Rb_tree_increment(local_7f8);
  } while( true );
}

Assistant:

void CampaignReader::InitTransports()
{
    std::string path = m_Name;
    if (!adios2sys::SystemTools::FileExists(path) && path[0] != '/' && path[0] != '\\' &&
        !m_Options.campaignstorepath.empty())
    {
        std::string path2 = m_Options.campaignstorepath + PathSeparator + m_Name;
        if (adios2sys::SystemTools::FileExists(path2))
        {
            path = path2;
        }
    }

    int rc = sqlite3_open(path.c_str(), &m_DB);
    if (rc)
    {
        std::string dbmsg(sqlite3_errmsg(m_DB));
        sqlite3_close(m_DB);
        helper::Throw<std::invalid_argument>("Engine", "CampaignReader", "Open",
                                             "Cannot open database" + path + ": " + dbmsg);
    }

    ReadCampaignData(m_DB, m_CampaignData);

    if (m_Options.verbose > 0)
    {
        std::cout << "Local hostname = " << m_Options.hostname << "\n";
        std::cout << "Database result:\n  version = " << m_CampaignData.version.version
                  << "\n  hosts:\n";

        for (size_t hostidx = 0; hostidx < m_CampaignData.hosts.size(); ++hostidx)
        {
            CampaignHost &h = m_CampaignData.hosts[hostidx];
            std::cout << "    host = " << h.hostname << "  long name = " << h.longhostname
                      << "  directories: \n";
            for (size_t diridx = 0; diridx < h.dirIdx.size(); ++diridx)
            {
                std::cout << "      dir = " << m_CampaignData.directory[h.dirIdx[diridx]] << "\n";
            }
        }
        std::cout << "  keys:\n";
        for (size_t keyidx = 0; keyidx < m_CampaignData.keys.size(); ++keyidx)
        {
            CampaignKey &k = m_CampaignData.keys[keyidx];
            std::cout << "    key = " << k.id << "\n";
        }
        std::cout << "  datasets:\n";
        for (auto &it : m_CampaignData.bpdatasets)
        {
            CampaignBPDataset &ds = it.second;
            std::cout << "    " << m_CampaignData.hosts[ds.hostIdx].hostname << ":"
                      << m_CampaignData.directory[ds.dirIdx] << PathSeparator << ds.name << "\n";
            std::cout << "      uuid: " << ds.uuid << "\n";
            for (auto &bpf : ds.files)
            {
                std::cout << "      file: " << bpf.name << "\n";
            }
        }
    }

    // std::string cs = m_Comm.BroadcastFile(m_Name, "broadcast campaign file");
    // nlohmann::json js = nlohmann::json::parse(cs);
    // std::cout << "JSON rank " << m_ReaderRank << ": " << js.size() <<
    // std::endl;
    std::unique_ptr<Remote> connectionManager = nullptr;
    int i = -1;
    for (auto &it : m_CampaignData.bpdatasets)
    {
        ++i;
        CampaignBPDataset &ds = it.second;
        adios2::core::IO &io = m_IO.m_ADIOS.DeclareIO("CampaignReader" + std::to_string(i));
        std::string localPath;
        if (m_CampaignData.hosts[ds.hostIdx].hostname != m_Options.hostname)
        {
            bool done = false;
            auto it = m_HostOptions.find(m_CampaignData.hosts[ds.hostIdx].hostname);
            if (it != m_HostOptions.end())
            {
                const HostConfig &ho = (it->second).front();
                if (ho.protocol == HostAccessProtocol::S3)
                {
                    const std::string endpointURL = ho.endpoint;
                    const std::string objPath = m_CampaignData.directory[ds.dirIdx] + "/" + ds.name;
                    Params p;
                    p.emplace("Library", "awssdk");
                    p.emplace("endpoint", endpointURL);
                    p.emplace("cache", m_Options.cachepath + PathSeparator +
                                           m_CampaignData.hosts[ds.hostIdx].hostname +
                                           PathSeparator + m_Name);
                    p.emplace("verbose", std::to_string(ho.verbose));
                    p.emplace("recheck_metadata", (ho.recheckMetadata ? "true" : "false"));
                    io.AddTransport("File", p);
                    io.SetEngine("BP5");
                    localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                    if (ho.isAWS_EC2)
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=false");
                    }
                    else
                    {
                        adios2sys::SystemTools::PutEnv("AWS_EC2_METADATA_DISABLED=true");
                    }

                    if (ho.awsProfile.empty())
                    {
                        adios2sys::SystemTools::PutEnv("AWS_PROFILE=default");
                    }
                    else
                    {
                        std::string es = "AWS_PROFILE=" + ho.awsProfile;
                        adios2sys::SystemTools::PutEnv(es);
                    }

                    done = true;
                }
            }

            if (!done)
            {
                const std::string remotePath =
                    m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
                const std::string remoteURL =
                    m_CampaignData.hosts[ds.hostIdx].hostname + ":" + remotePath;
                localPath = m_Options.cachepath + PathSeparator + ds.uuid.substr(0, 3) +
                            PathSeparator + ds.uuid;
                if (m_Options.verbose > 0)
                {
                    std::cout << "Open remote file " << remoteURL
                              << "\n    and use local cache for metadata at " << localPath << " \n";
                }
                helper::CreateDirectory(localPath);

                std::string keyhex;
                if (ds.hasKey)
                {
                    if (m_Options.verbose > 0)
                    {
                        std::cout << "The dataset is key protected with key id "
                                  << m_CampaignData.keys[ds.keyIdx].id << "\n";
                    }
#ifdef ADIOS2_HAVE_SODIUM
                    if (m_CampaignData.keys[ds.keyIdx].keyHex.empty())
                    {
                        // Retrieve key
                        if (!connectionManager)
                        {
                            connectionManager = std::unique_ptr<Remote>(
                                new Remote(core::ADIOS::StaticGetHostOptions()));
                        }
                        m_CampaignData.keys[ds.keyIdx].keyHex =
                            connectionManager->GetKeyFromConnectionManager(
                                m_CampaignData.keys[ds.keyIdx].id);

                        if (m_Options.verbose > 0)
                        {
                            std::cout << "-- Received key " << m_CampaignData.keys[ds.keyIdx].keyHex
                                      << "\n";
                        }
                    }

                    if (m_CampaignData.keys[ds.keyIdx].keyHex == "0")
                    {
                        // We received no key, ignore files encrypted with this key
                        std::cerr << "ERROR: don't have the key "
                                  << m_CampaignData.keys[ds.keyIdx].id << " to decrypt " << ds.name
                                  << ". Ignoring this dataset." << std::endl;
                        continue;
                    }

                    keyhex = m_CampaignData.keys[ds.keyIdx].keyHex;
#else
                    helper::Throw<std::runtime_error>(
                        "Engine", "CampaignReader", "InitTransports",
                        "ADIOS needs to be built with libsodium and with SST to "
                        "be able to process protected campaign files");
#endif
                }

                for (auto &bpf : ds.files)
                {
                    SaveToFile(m_DB, localPath + PathSeparator + bpf.name, bpf, keyhex);
                }
                io.SetParameter("RemoteDataPath", remotePath);
                io.SetParameter("RemoteHost", m_CampaignData.hosts[ds.hostIdx].hostname);
                io.SetParameter("UUID", ds.uuid);

                // Save info in cache directory for cache manager and for humans
                {
                    std::ofstream f(localPath + PathSeparator + "info.txt");
                    if (f.is_open())
                    {
                        f << "Campaign = " << m_Name << "\n";
                        f << "Dataset = " << ds.name << "\n";
                        f << "RemoteHost = " << m_CampaignData.hosts[ds.hostIdx].hostname << "\n";
                        f << "RemoteDataPath = " << remotePath << "\n";
                        f.close();
                    }
                }
            }
        }
        else
        {
            localPath = m_CampaignData.directory[ds.dirIdx] + PathSeparator + ds.name;
            if (m_Options.verbose > 0)
            {
                std::cout << "Open local file " << localPath << "\n";
            }
        }

        adios2::core::Engine &e = io.Open(localPath, m_OpenMode, m_Comm.Duplicate());

        m_IOs.push_back(&io);
        m_Engines.push_back(&e);

        auto vmap = io.GetAvailableVariables();
        auto amap = io.GetAvailableAttributes();
        VarInternalInfo internalInfo(nullptr, m_IOs.size() - 1, m_Engines.size() - 1);

        for (auto &vr : vmap)
        {
            auto vname = vr.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + vname;

            const DataType type = io.InquireVariableType(vname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Variable<T> *vi = io.InquireVariable<T>(vname);                                            \
        Variable<T> v = DuplicateVariable(vi, m_IO, newname, internalInfo);                        \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }

        for (auto &ar : amap)
        {
            auto aname = ar.first;
            std::string fname = ds.name;
            std::string newname = fname + "/" + aname;

            const DataType type = io.InquireAttributeType(aname);

            if (type == DataType::Struct)
            {
            }
#define declare_type(T)                                                                            \
    else if (type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        Attribute<T> *ai = io.InquireAttribute<T>(aname);                                          \
        Attribute<T> v = DuplicateAttribute(ai, m_IO, newname);                                    \
    }

            ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        }
    }
}